

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBindingTableBase.hpp
# Opt level: O3

void __thiscall
Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::ShaderBindingTableBase
          (ShaderBindingTableBase<Diligent::EngineVkImplTraits> *this,
          IReferenceCounters *pRefCounters,RenderDeviceImplType *pDevice,
          ShaderBindingTableDesc *Desc,bool bIsDeviceInternal)

{
  ushort uVar1;
  PipelineStateVkImpl *pObj;
  RenderDeviceVkImpl *pRVar2;
  RenderDeviceVkImpl *pRVar3;
  RayTracingPipelineDesc *pRVar4;
  
  DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
  ::DeviceObjectBase(&this->
                      super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                     ,pRefCounters,pDevice,Desc,bIsDeviceInternal);
  (this->
  super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
  ).super_ObjectBase<Diligent::IShaderBindingTableVk>.
  super_RefCountedObject<Diligent::IShaderBindingTableVk>.super_IShaderBindingTableVk.
  super_IShaderBindingTable.super_IDeviceObject.super_IObject =
       (IObject)&PTR_QueryInterface_00920a88;
  (this->m_RayGenShaderRecord).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_RayGenShaderRecord).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_RayGenShaderRecord).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_MissShadersRecord).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_MissShadersRecord).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_MissShadersRecord).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_CallableShadersRecord).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_CallableShadersRecord).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_CallableShadersRecord).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_HitGroupsRecord).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_HitGroupsRecord).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_HitGroupsRecord).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_pPSO).m_pObject = (PipelineStateVkImpl *)0x0;
  (this->m_pBuffer).m_pObject = (BufferVkImpl *)0x0;
  this->m_ShaderRecordSize = 0;
  this->m_ShaderRecordStride = 0;
  this->m_Changed = true;
  (this->m_DbgHitGroupBindings).
  super__Vector_base<Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::HitGroupBinding,_std::allocator<Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::HitGroupBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_DbgHitGroupBindings).
  super__Vector_base<Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::HitGroupBinding,_std::allocator<Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::HitGroupBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_DbgHitGroupBindings).
  super__Vector_base<Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::HitGroupBinding,_std::allocator<Diligent::ShaderBindingTableBase<Diligent::EngineVkImplTraits>::HitGroupBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar2 = DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                      );
  pRVar3 = DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
           ::GetDevice(&this->
                        super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
                      );
  if ((pRVar3->
      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
      ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.RayTracing ==
      DEVICE_FEATURE_STATE_DISABLED) {
    LogError<true,char[39]>
              (false,"ShaderBindingTableBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBindingTableBase.hpp"
               ,0x56,(char (*) [39])"Ray tracing is not supported by device");
  }
  ValidateShaderBindingTableDesc
            (&(this->
              super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
              ).m_Desc,
             (pRVar2->
             super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
             ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
             ShaderGroupHandleSize,
             (pRVar2->
             super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
             ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
             MaxShaderRecordStride);
  pObj = (PipelineStateVkImpl *)
         (this->
         super_DeviceObjectBase<Diligent::IShaderBindingTableVk,_Diligent::RenderDeviceVkImpl,_Diligent::ShaderBindingTableDesc>
         ).m_Desc.pPSO;
  if (pObj != (PipelineStateVkImpl *)0x0) {
    CheckDynamicType<Diligent::PipelineStateVkImpl,Diligent::IPipelineState>((IPipelineState *)pObj)
    ;
  }
  RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator=(&this->m_pPSO,pObj);
  pRVar4 = PipelineStateBase<Diligent::EngineVkImplTraits>::GetRayTracingPipelineDesc
                     (&((this->m_pPSO).m_pObject)->
                       super_PipelineStateBase<Diligent::EngineVkImplTraits>);
  uVar1 = pRVar4->ShaderRecordSize;
  this->m_ShaderRecordSize = (uint)uVar1;
  this->m_ShaderRecordStride =
       (uint)uVar1 +
       (pRVar2->
       super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
       ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.RayTracing.
       ShaderGroupHandleSize;
  return;
}

Assistant:

ShaderBindingTableBase(IReferenceCounters*           pRefCounters,
                           RenderDeviceImplType*         pDevice,
                           const ShaderBindingTableDesc& Desc,
                           bool                          bIsDeviceInternal = false) :
        TDeviceObjectBase{pRefCounters, pDevice, Desc, bIsDeviceInternal}
    {
        const RayTracingProperties& RTProps = this->GetDevice()->GetAdapterInfo().RayTracing;
        if (!this->GetDevice()->GetFeatures().RayTracing)
            LOG_ERROR_AND_THROW("Ray tracing is not supported by device");

        ValidateShaderBindingTableDesc(this->m_Desc, RTProps.ShaderGroupHandleSize, RTProps.MaxShaderRecordStride);

        this->m_pPSO               = ClassPtrCast<PipelineStateImplType>(this->m_Desc.pPSO);
        this->m_ShaderRecordSize   = this->m_pPSO->GetRayTracingPipelineDesc().ShaderRecordSize;
        this->m_ShaderRecordStride = this->m_ShaderRecordSize + RTProps.ShaderGroupHandleSize;
    }